

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void * sqlite3ArrayAllocate(sqlite3 *db,void *pArray,int szEntry,int *pnEntry,int *pIdx)

{
  uint uVar1;
  void *pvVar2;
  int iVar3;
  
  uVar1 = *pnEntry;
  pvVar2 = pArray;
  if ((uVar1 & uVar1 - 1) == 0) {
    iVar3 = 1;
    if (uVar1 != 0) {
      iVar3 = uVar1 * 2;
    }
    pvVar2 = sqlite3DbRealloc(db,pArray,(long)(iVar3 * szEntry));
    if (pvVar2 == (void *)0x0) {
      *pIdx = -1;
      return pArray;
    }
  }
  memset((void *)((long)(int)(uVar1 * szEntry) + (long)pvVar2),0,(ulong)(uint)szEntry);
  *pIdx = uVar1;
  *pnEntry = *pnEntry + 1;
  return pvVar2;
}

Assistant:

SQLITE_PRIVATE void *sqlite3ArrayAllocate(
  sqlite3 *db,      /* Connection to notify of malloc failures */
  void *pArray,     /* Array of objects.  Might be reallocated */
  int szEntry,      /* Size of each object in the array */
  int *pnEntry,     /* Number of objects currently in use */
  int *pIdx         /* Write the index of a new slot here */
){
  char *z;
  int n = *pnEntry;
  if( (n & (n-1))==0 ){
    int sz = (n==0) ? 1 : 2*n;
    void *pNew = sqlite3DbRealloc(db, pArray, sz*szEntry);
    if( pNew==0 ){
      *pIdx = -1;
      return pArray;
    }
    pArray = pNew;
  }
  z = (char*)pArray;
  memset(&z[n * szEntry], 0, szEntry);
  *pIdx = n;
  ++*pnEntry;
  return pArray;
}